

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void print_usage(void)

{
  int local_c;
  WORD32 num_entries;
  WORD32 i;
  
  local_c = 0;
  printf("\nUsage:\n");
  for (; local_c < 0x17; local_c = local_c + 1) {
    printf("%-32s\t %s",(long)local_c * 0x288 + 0x2db0b4,(long)local_c * 0x288 + 0x2db138);
  }
  return;
}

Assistant:

void print_usage(void)
{
    WORD32 i = 0;
    WORD32 num_entries = sizeof(argument_mapping) / sizeof(argument_t);
    printf("\nUsage:\n");
    while(i < num_entries)
    {
        printf("%-32s\t %s", argument_mapping[i].argument_name,
               argument_mapping[i].description);
        i++;
    }
}